

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void pnga_fill(Integer g_a,void *val)

{
  int iVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  undefined8 *puVar7;
  char *pcVar8;
  long lVar9;
  bool bVar10;
  Integer I_elems;
  char err_string [256];
  
  iVar3 = _ga_sync_end;
  bVar10 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  iVar1 = GA[g_a + 1000].p_handle;
  _ga_sync_end = _ga_sync_begin;
  if (bVar10) {
    pnga_pgroup_sync((long)iVar1);
  }
  if ((g_a < -1000) || ((long)_max_global_array <= g_a + 1000)) {
    sprintf(err_string,"%s: INVALID ARRAY HANDLE","ga_fill");
    pnga_error(err_string,g_a);
  }
  if (GA[g_a + 1000].actv == 0) {
    sprintf(err_string,"%s: ARRAY NOT ACTIVE","ga_fill");
    pnga_error(err_string,g_a);
  }
  iVar4 = (int)g_a + 1000;
  uVar5 = GA[iVar4].type - 1000;
  if ((0xff < uVar5) || (ga_types[uVar5].active == 0)) {
    pnga_error("type not yet supported",(long)GA[iVar4].type);
  }
  lVar6 = GA[iVar4].size / (long)GA[iVar4].elemsize;
  if (GA[iVar4].block_total < 0) {
    lVar9 = GAme;
    if (-1 < iVar1) {
      lVar9 = (long)PGRP_LIST[GA[iVar4].p_handle].map_proc_list[GAme];
    }
    err_string._0_8_ = GA[iVar4].ptr[lVar9];
    switch(GA[iVar4].type) {
    case 0x3e9:
      lVar9 = 0;
      if (lVar6 < 1) {
        lVar6 = lVar9;
      }
      for (; lVar6 != lVar9; lVar9 = lVar9 + 1) {
        *(undefined4 *)(err_string._0_8_ + lVar9 * 4) = *val;
      }
      break;
    case 0x3ea:
      lVar9 = 0;
      if (lVar6 < 1) {
        lVar6 = lVar9;
      }
      for (; lVar6 != lVar9; lVar9 = lVar9 + 1) {
        *(undefined8 *)(err_string._0_8_ + lVar9 * 8) = *val;
      }
      break;
    case 0x3eb:
      lVar9 = 0;
      if (lVar6 < 1) {
        lVar6 = lVar9;
      }
      for (; lVar6 != lVar9; lVar9 = lVar9 + 1) {
        *(undefined4 *)(err_string._0_8_ + lVar9 * 4) = *val;
      }
      break;
    case 0x3ec:
      lVar9 = 0;
      if (lVar6 < 1) {
        lVar6 = lVar9;
      }
      for (; lVar6 != lVar9; lVar9 = lVar9 + 1) {
        *(undefined8 *)(err_string._0_8_ + lVar9 * 8) = *val;
      }
      break;
    default:
      pnga_error("type not supported",(long)GA[iVar4].type);
      break;
    case 0x3ee:
      lVar9 = 0;
      if (lVar6 < 1) {
        lVar6 = lVar9;
      }
      for (; lVar6 != lVar9; lVar9 = lVar9 + 1) {
        *(undefined8 *)(err_string._0_8_ + lVar9 * 8) = *val;
      }
      break;
    case 0x3ef:
      pcVar8 = (char *)err_string._0_8_;
      lVar9 = 0;
      if (0 < lVar6) {
        lVar9 = lVar6;
      }
      while (lVar9 != 0) {
        uVar2 = *(undefined8 *)((long)val + 8);
        *(undefined8 *)pcVar8 = *val;
        *(undefined8 *)(pcVar8 + 8) = uVar2;
        pcVar8 = pcVar8 + 0x10;
        lVar9 = lVar9 + -1;
      }
      break;
    case 0x3f8:
      lVar9 = 0;
      if (lVar6 < 1) {
        lVar6 = lVar9;
      }
      for (; lVar6 != lVar9; lVar9 = lVar9 + 1) {
        *(undefined8 *)(err_string._0_8_ + lVar9 * 8) = *val;
      }
    }
  }
  else {
    I_elems = lVar6;
    pnga_access_block_segment_ptr(g_a,GAme,err_string,&I_elems);
    switch(GA[iVar4].type) {
    case 0x3e9:
      lVar9 = 0;
      lVar6 = I_elems;
      if (I_elems < 1) {
        lVar6 = lVar9;
      }
      for (; lVar6 != lVar9; lVar9 = lVar9 + 1) {
        *(undefined4 *)(err_string._0_8_ + lVar9 * 4) = *val;
      }
      break;
    case 0x3ea:
      lVar9 = 0;
      lVar6 = I_elems;
      if (I_elems < 1) {
        lVar6 = lVar9;
      }
      for (; lVar6 != lVar9; lVar9 = lVar9 + 1) {
        *(undefined8 *)(err_string._0_8_ + lVar9 * 8) = *val;
      }
      break;
    case 0x3eb:
      lVar9 = 0;
      lVar6 = I_elems;
      if (I_elems < 1) {
        lVar6 = lVar9;
      }
      for (; lVar6 != lVar9; lVar9 = lVar9 + 1) {
        *(undefined4 *)(err_string._0_8_ + lVar9 * 4) = *val;
      }
      break;
    case 0x3ec:
      lVar9 = 0;
      lVar6 = I_elems;
      if (I_elems < 1) {
        lVar6 = lVar9;
      }
      for (; lVar6 != lVar9; lVar9 = lVar9 + 1) {
        *(undefined8 *)(err_string._0_8_ + lVar9 * 8) = *val;
      }
      break;
    default:
      pnga_error("type not supported",(long)GA[iVar4].type);
      break;
    case 0x3ee:
      lVar9 = 0;
      lVar6 = I_elems;
      if (I_elems < 1) {
        lVar6 = lVar9;
      }
      for (; lVar6 != lVar9; lVar9 = lVar9 + 1) {
        *(undefined8 *)(err_string._0_8_ + lVar9 * 8) = *val;
      }
      break;
    case 0x3ef:
      puVar7 = (undefined8 *)err_string._0_8_;
      lVar6 = 0;
      if (0 < I_elems) {
        lVar6 = I_elems;
      }
      while (lVar6 != 0) {
        uVar2 = *(undefined8 *)((long)val + 8);
        *puVar7 = *val;
        puVar7[1] = uVar2;
        puVar7 = puVar7 + 2;
        lVar6 = lVar6 + -1;
      }
      break;
    case 0x3f8:
      lVar9 = 0;
      lVar6 = I_elems;
      if (I_elems < 1) {
        lVar6 = lVar9;
      }
      for (; lVar6 != lVar9; lVar9 = lVar9 + 1) {
        *(undefined8 *)(err_string._0_8_ + lVar9 * 8) = *val;
      }
    }
    pnga_release_block_segment(g_a,GAme);
  }
  if (iVar3 != 0) {
    pnga_pgroup_sync((long)iVar1);
  }
  return;
}

Assistant:

void pnga_fill(Integer g_a, void* val)
{
  int i,handle=GA_OFFSET + (int)g_a;
  char *ptr;
  int local_sync_begin,local_sync_end;
  C_Long elems;
  Integer grp_id;
  Integer num_blocks;


  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous sync masking*/
  grp_id = pnga_get_pgroup(g_a);
  if(local_sync_begin)pnga_pgroup_sync(grp_id);


  ga_check_handleM(g_a, "ga_fill");
  gam_checktype(GA[handle].type);
  elems = GA[handle].size/((C_Long)GA[handle].elemsize);
  num_blocks = GA[handle].block_total;

  if (num_blocks < 0) {
    /* Bruce..Please CHECK if this is correct */
    if (grp_id >= 0){  
      Integer grp_me = PGRP_LIST[GA[handle].p_handle].map_proc_list[GAme];
      ptr = GA[handle].ptr[grp_me];
    }
    else  ptr = GA[handle].ptr[GAme];

    switch (GA[handle].type){
      case C_DCPL: 
        for(i=0; i<elems;i++)((DoubleComplex*)ptr)[i]=*(DoubleComplex*)val;
        break;
      case C_SCPL: 
        for(i=0; i<elems;i++)((SingleComplex*)ptr)[i]=*(SingleComplex*)val;
        break;
      case C_DBL:  
        for(i=0; i<elems;i++)((double*)ptr)[i]=*(double*)val;
        break;
      case C_INT:  
        for(i=0; i<elems;i++)((int*)ptr)[i]=*(int*)val;
        break;
      case C_FLOAT:
        for(i=0; i<elems;i++)((float*)ptr)[i]=*(float*)val;
        break;     
      case C_LONG:
        for(i=0; i<elems;i++)((long*)ptr)[i]=*(long*)val;
        break;
      case C_LONGLONG:
        for(i=0; i<elems;i++)((long long*)ptr)[i]=*( long long*)val;
        break;
      default:
        pnga_error("type not supported",GA[handle].type);
    }
  } else {
    Integer I_elems = (Integer)elems;
    pnga_access_block_segment_ptr(g_a,GAme,&ptr,&I_elems);
    elems = (C_Long)I_elems;
    switch (GA[handle].type){
      case C_DCPL: 
        for(i=0; i<elems;i++)((DoubleComplex*)ptr)[i]=*(DoubleComplex*)val;
        break;
      case C_SCPL: 
        for(i=0; i<elems;i++)((SingleComplex*)ptr)[i]=*(SingleComplex*)val;
        break;
      case C_DBL:  
        for(i=0; i<elems;i++)((double*)ptr)[i]=*(double*)val;
        break;
      case C_INT:  
        for(i=0; i<elems;i++)((int*)ptr)[i]=*(int*)val;
        break;
      case C_FLOAT:
        for(i=0; i<elems;i++)((float*)ptr)[i]=*(float*)val;
        break;     
      case C_LONG:
        for(i=0; i<elems;i++)((long*)ptr)[i]=*(long*)val;
        break;
      case C_LONGLONG:
        for(i=0; i<elems;i++)((long long*)ptr)[i]=*(long long*)val;
        break;
      default:
        pnga_error("type not supported",GA[handle].type);
    }
    pnga_release_block_segment(g_a,GAme);
  }

  if(local_sync_end)pnga_pgroup_sync(grp_id);

}